

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

void __thiscall
slang::ast::PackedStructType::PackedStructType
          (PackedStructType *this,Compilation *compilation,bool isSigned,SourceLocation loc,
          ASTContext *context)

{
  int iVar1;
  SymbolIndex SVar2;
  
  (this->super_IntegralType).super_Type.super_Symbol.kind = PackedStructType;
  (this->super_IntegralType).super_Type.super_Symbol.name._M_len = 0;
  (this->super_IntegralType).super_Type.super_Symbol.name._M_str = "";
  (this->super_IntegralType).super_Type.super_Symbol.location = loc;
  (this->super_IntegralType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->super_IntegralType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  (this->super_IntegralType).super_Type.super_Symbol.nextInScope = (Symbol *)0x0;
  (this->super_IntegralType).super_Type.super_Symbol.indexInScope = 0;
  (this->super_IntegralType).super_Type.canonical = (Type *)this;
  (this->super_IntegralType).bitWidth = 0;
  (this->super_IntegralType).isSigned = isSigned;
  (this->super_IntegralType).isFourState = false;
  Scope::Scope(&this->super_Scope,compilation,(Symbol *)this);
  iVar1 = compilation->nextStructSystemId;
  compilation->nextStructSystemId = iVar1 + 1;
  this->systemId = iVar1;
  SVar2 = context->lookupIndex;
  (this->super_IntegralType).super_Type.super_Symbol.parentScope = (context->scope).ptr;
  (this->super_IntegralType).super_Type.super_Symbol.indexInScope = SVar2;
  return;
}

Assistant:

PackedStructType::PackedStructType(Compilation& compilation, bool isSigned, SourceLocation loc,
                                   const ASTContext& context) :
    IntegralType(SymbolKind::PackedStructType, "", loc, 0, isSigned, false),
    Scope(compilation, this), systemId(compilation.getNextStructSystemId()) {

    // Struct types don't live as members of the parent scope (they're "owned" by
    // the declaration containing them) but we hook up the parent pointer so that
    // it can participate in name lookups.
    setParent(*context.scope, context.lookupIndex);
}